

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8.h
# Opt level: O3

void ncnn::conv3x3s1_winograd63_pack8_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  float *pfVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  size_t _elemsize;
  int *piVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [32];
  uint uVar26;
  int _w;
  int _h;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  Option *opt_00;
  long lVar47;
  int w_tiles;
  Mat *dst;
  long lVar48;
  float *pfVar49;
  ulong uVar50;
  int iVar51;
  int iVar52;
  ulong uVar53;
  long lVar54;
  long lVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float in_register_0000151c;
  float fVar103;
  float in_register_0000155c;
  long local_840;
  long local_838;
  Mat local_800;
  Mat *local_7b0;
  ulong local_7a8;
  Mat local_7a0;
  long local_758;
  long local_750;
  long local_748;
  undefined8 local_740;
  undefined8 local_738;
  undefined8 local_730;
  undefined8 local_728;
  ulong local_720;
  void *local_718;
  long local_710;
  ulong local_708;
  Mat local_700;
  Mat local_6b0;
  float afStack_660 [396];
  
  iVar51 = bottom_blob->c;
  _elemsize = bottom_blob->elemsize;
  iVar43 = bottom_blob->elempack;
  iVar52 = top_blob->w;
  iVar44 = top_blob->h;
  iVar46 = top_blob->c;
  piVar8 = bottom_blob->refcount;
  local_7a0.data = bottom_blob->data;
  local_7a0.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  local_7a0.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_7a0.elemsize._0_4_ = (undefined4)_elemsize;
  local_7a0.elemsize._4_4_ = (undefined4)(_elemsize >> 0x20);
  local_7a0.allocator = bottom_blob->allocator;
  iVar45 = bottom_blob->h;
  uVar34 = bottom_blob->dims;
  uVar35 = bottom_blob->w;
  uVar36 = bottom_blob->h;
  uVar37 = bottom_blob->d;
  iVar42 = bottom_blob->w;
  local_7a0.cstep = bottom_blob->cstep;
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + 1;
    UNLOCK();
    iVar42 = bottom_blob->w;
    iVar45 = bottom_blob->h;
  }
  iVar52 = (iVar52 + 5) / 6;
  _w = iVar52 * 6;
  iVar44 = (iVar44 + 5) / 6;
  _h = iVar44 * 6;
  local_7b0 = top_blob;
  local_7a0.elempack = iVar43;
  local_7a0.dims = uVar34;
  local_7a0.w = uVar35;
  local_7a0.h = uVar36;
  local_7a0.d = uVar37;
  local_7a0.c = iVar51;
  copy_make_border(bottom_blob,&local_7a0,0,(_h - iVar45) + 2,0,(_w - iVar42) + 2,0,0.0,opt);
  local_6b0.cstep = 0;
  local_6b0.data = (void *)0x0;
  local_6b0.refcount._0_4_ = 0;
  local_6b0.refcount._4_4_ = 0;
  local_6b0.elemsize._0_4_ = 0;
  local_6b0._20_8_ = 0;
  local_6b0.allocator = (Allocator *)0x0;
  local_6b0.dims = 0;
  local_6b0.w = 0;
  local_6b0.h = 0;
  local_6b0.d = 0;
  local_6b0.c = 0;
  Mat::create(&local_6b0,iVar44 * iVar52,0x40,iVar51,_elemsize,iVar43,opt->workspace_allocator);
  conv3x3s1_winograd63_transform_input_pack8_avx(&local_7a0,&local_6b0,opt_00);
  dst = local_7b0;
  piVar8 = (int *)CONCAT44(local_7a0.refcount._4_4_,local_7a0.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_7a0.allocator == (Allocator *)0x0) {
        if (local_7a0.data != (void *)0x0) {
          free(local_7a0.data);
        }
      }
      else {
        (*(local_7a0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_7a0.cstep = 0;
  local_7a0.data = (void *)0x0;
  local_7a0.refcount._0_4_ = 0;
  local_7a0.refcount._4_4_ = 0;
  local_7a0.elemsize._0_4_ = 0;
  local_7a0.elemsize._4_4_ = 0;
  local_7a0.elempack = 0;
  local_7a0.h = 0;
  local_7a0.d = 0;
  local_7a0.c = 0;
  local_7a0.allocator = (Allocator *)0x0;
  local_7a0.dims = 0;
  local_7a0.w = 0;
  local_700.cstep = 0;
  local_700.data = (void *)0x0;
  local_700.refcount._0_4_ = 0;
  local_700.refcount._4_4_ = 0;
  local_700.elemsize._0_4_ = 0;
  local_700.elemsize._4_4_ = 0;
  local_700.elempack = 0;
  local_700.allocator = (Allocator *)0x0;
  local_700.dims = 0;
  local_700.w = 0;
  local_700.h = 0;
  local_700.d = 0;
  local_700.c = 0;
  convolution_winograd_dot_pack8_avx(&local_6b0,iVar46,kernel_tm,&local_700,opt);
  local_800.cstep = 0;
  local_800.data = (void *)0x0;
  local_800.refcount._0_4_ = 0;
  local_800.refcount._4_4_ = 0;
  local_800.elemsize._0_4_ = 0;
  local_800.elemsize._4_4_ = 0;
  local_800.elempack = 0;
  local_800.allocator = (Allocator *)0x0;
  local_800.dims = 0;
  local_800.w = 0;
  local_800.h = 0;
  local_800.d = 0;
  local_800.c = 0;
  if ((_w == dst->w) && (_h == dst->h)) {
    if (&local_800 == dst) {
      iVar52 = 0;
      iVar44 = 0;
      goto LAB_0024c5d6;
    }
    piVar8 = dst->refcount;
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + 1;
      UNLOCK();
    }
    local_800.data = dst->data;
    local_800.refcount._0_4_ = SUB84(dst->refcount,0);
    local_800.refcount._4_4_ = (undefined4)((ulong)dst->refcount >> 0x20);
    local_800.elemsize._0_4_ = (undefined4)dst->elemsize;
    local_800.elemsize._4_4_ = (undefined4)(dst->elemsize >> 0x20);
    local_800.elempack = dst->elempack;
    local_800.allocator = dst->allocator;
    uVar38 = dst->dims;
    uVar39 = dst->w;
    uVar40 = dst->h;
    uVar41 = dst->d;
    local_800.c = dst->c;
    local_800.cstep = dst->cstep;
    iVar51 = dst->w;
    iVar43 = dst->h;
    local_800.dims = uVar38;
    local_800.w = uVar39;
    local_800.h = uVar40;
    local_800.d = uVar41;
  }
  else {
    Mat::create(&local_800,_w,_h,iVar46,_elemsize,iVar43,opt->workspace_allocator);
    iVar51 = local_800.w;
    iVar43 = local_800.h;
  }
  iVar52 = iVar51;
  iVar44 = iVar43;
  if (0 < local_800.c) {
    local_718 = bias->data;
    local_708 = (ulong)(uint)(iVar43 / 6);
    uVar26 = iVar51 / 6;
    iVar46 = uVar26 * (iVar43 / 6);
    local_720 = (ulong)(uint)local_800.c;
    local_710 = (ulong)uVar26 * 0x20;
    local_728 = (long)(iVar46 * 8) * 4;
    local_730 = (long)(iVar46 * 0x10) * 4;
    local_738 = (long)(iVar46 * 0x18) * 4;
    local_740 = (long)(iVar46 * 0x20) * 4;
    local_748 = (long)(iVar46 * 0x28) * 4;
    local_750 = (long)(iVar46 * 0x30) * 4;
    local_758 = (long)(iVar46 * 0x38) * 4;
    uVar50 = 0;
    do {
      local_7a8 = uVar50;
      if (local_718 == (void *)0x0) {
        fVar58 = 0.0;
        fVar59 = 0.0;
        fVar56 = 0.0;
        fVar57 = 0.0;
        fVar60 = 0.0;
        fVar61 = 0.0;
        fVar62 = 0.0;
        fVar63 = 0.0;
      }
      else {
        pfVar49 = (float *)((long)local_718 + local_7a8 * 0x20);
        fVar56 = *pfVar49;
        fVar57 = pfVar49[1];
        fVar58 = pfVar49[2];
        fVar59 = pfVar49[3];
        fVar60 = pfVar49[4];
        fVar61 = pfVar49[5];
        fVar62 = pfVar49[6];
        fVar63 = pfVar49[7];
      }
      if (5 < iVar43) {
        lVar55 = CONCAT44(local_700.elemsize._4_4_,(undefined4)local_700.elemsize) * local_700.cstep
                 * local_7a8;
        local_840 = (long)local_800.data +
                    local_800.cstep *
                    CONCAT44(local_800.elemsize._4_4_,(undefined4)local_800.elemsize) * local_7a8 +
                    0xa0;
        local_838 = 0;
        uVar50 = 0;
        do {
          if (5 < iVar51) {
            uVar53 = 0;
            lVar54 = local_838;
            do {
              lVar47 = -0x100;
              lVar48 = lVar54;
              do {
                auVar2 = *(undefined1 (*) [32])((long)local_700.data + lVar48 + local_728 + lVar55);
                auVar3 = *(undefined1 (*) [32])((long)local_700.data + lVar48 + local_730 + lVar55);
                auVar4 = *(undefined1 (*) [32])((long)local_700.data + lVar48 + local_738 + lVar55);
                auVar5 = *(undefined1 (*) [32])((long)local_700.data + lVar48 + local_740 + lVar55);
                auVar6 = *(undefined1 (*) [32])((long)local_700.data + lVar48 + local_748 + lVar55);
                auVar7 = *(undefined1 (*) [32])((long)local_700.data + lVar48 + local_750 + lVar55);
                fVar88 = auVar3._0_4_ + auVar2._0_4_;
                fVar90 = auVar3._4_4_ + auVar2._4_4_;
                fVar92 = auVar3._8_4_ + auVar2._8_4_;
                fVar94 = auVar3._12_4_ + auVar2._12_4_;
                fVar96 = auVar3._16_4_ + auVar2._16_4_;
                fVar98 = auVar3._20_4_ + auVar2._20_4_;
                fVar100 = auVar3._24_4_ + auVar2._24_4_;
                fVar102 = auVar3._28_4_ + auVar2._28_4_;
                auVar2 = vsubps_avx(auVar2,auVar3);
                fVar72 = auVar5._0_4_ + auVar4._0_4_;
                fVar73 = auVar5._4_4_ + auVar4._4_4_;
                fVar74 = auVar5._8_4_ + auVar4._8_4_;
                fVar75 = auVar5._12_4_ + auVar4._12_4_;
                fVar76 = auVar5._16_4_ + auVar4._16_4_;
                fVar77 = auVar5._20_4_ + auVar4._20_4_;
                fVar78 = auVar5._24_4_ + auVar4._24_4_;
                fVar79 = auVar5._28_4_ + auVar4._28_4_;
                auVar3 = vsubps_avx(auVar4,auVar5);
                fVar80 = auVar7._0_4_ + auVar6._0_4_;
                fVar81 = auVar7._4_4_ + auVar6._4_4_;
                fVar82 = auVar7._8_4_ + auVar6._8_4_;
                fVar83 = auVar7._12_4_ + auVar6._12_4_;
                fVar84 = auVar7._16_4_ + auVar6._16_4_;
                fVar85 = auVar7._20_4_ + auVar6._20_4_;
                fVar86 = auVar7._24_4_ + auVar6._24_4_;
                fVar87 = auVar7._28_4_ + auVar6._28_4_;
                auVar4 = vsubps_avx(auVar6,auVar7);
                pfVar49 = (float *)((long)local_700.data + lVar48 + lVar55);
                fVar27 = pfVar49[1];
                fVar28 = pfVar49[2];
                fVar29 = pfVar49[3];
                fVar30 = pfVar49[4];
                fVar31 = pfVar49[5];
                fVar32 = pfVar49[6];
                fVar33 = pfVar49[7];
                fVar103 = in_register_0000151c + fVar79;
                in_register_0000151c = fVar103 + fVar102 + in_register_0000155c;
                fVar9 = auVar3._0_4_;
                fVar11 = auVar3._4_4_;
                fVar13 = auVar3._8_4_;
                fVar15 = auVar3._12_4_;
                fVar17 = auVar3._16_4_;
                fVar19 = auVar3._20_4_;
                fVar21 = auVar3._24_4_;
                fVar23 = auVar3._28_4_;
                fVar10 = auVar2._0_4_;
                fVar12 = auVar2._4_4_;
                fVar14 = auVar2._8_4_;
                fVar16 = auVar2._12_4_;
                fVar18 = auVar2._16_4_;
                fVar20 = auVar2._20_4_;
                fVar22 = auVar2._24_4_;
                fVar24 = auVar2._28_4_;
                fVar89 = auVar4._0_4_;
                fVar91 = auVar4._4_4_;
                fVar93 = auVar4._8_4_;
                fVar95 = auVar4._12_4_;
                fVar97 = auVar4._16_4_;
                fVar99 = auVar4._20_4_;
                fVar101 = auVar4._24_4_;
                pfVar1 = (float *)((long)local_700.data + lVar48 + local_758 + lVar55);
                fVar64 = *pfVar1;
                fVar65 = pfVar1[1];
                fVar66 = pfVar1[2];
                fVar67 = pfVar1[3];
                fVar68 = pfVar1[4];
                fVar69 = pfVar1[5];
                fVar70 = pfVar1[6];
                fVar71 = pfVar1[7];
                *(float *)((long)afStack_660 + lVar47 + 0x100) =
                     fVar88 + *pfVar49 + fVar80 * 32.0 + fVar72;
                *(float *)((long)afStack_660 + lVar47 + 0x104) =
                     fVar90 + fVar27 + fVar81 * 32.0 + fVar73;
                *(float *)((long)afStack_660 + lVar47 + 0x108) =
                     fVar92 + fVar28 + fVar82 * 32.0 + fVar74;
                *(float *)((long)afStack_660 + lVar47 + 0x10c) =
                     fVar94 + fVar29 + fVar83 * 32.0 + fVar75;
                *(float *)((long)afStack_660 + lVar47 + 0x110) =
                     fVar96 + fVar30 + fVar84 * 32.0 + fVar76;
                *(float *)((long)afStack_660 + lVar47 + 0x114) =
                     fVar98 + fVar31 + fVar85 * 32.0 + fVar77;
                *(float *)((long)afStack_660 + lVar47 + 0x118) =
                     fVar100 + fVar32 + fVar86 * 32.0 + fVar78;
                *(float *)((long)afStack_660 + lVar47 + 0x11c) = fVar102 + fVar33 + fVar103;
                *(float *)((long)afStack_660 + lVar47 + 0x200) =
                     fVar9 + fVar9 + fVar10 + fVar89 * 16.0;
                *(float *)((long)afStack_660 + lVar47 + 0x204) =
                     fVar11 + fVar11 + fVar12 + fVar91 * 16.0;
                *(float *)((long)afStack_660 + lVar47 + 0x208) =
                     fVar13 + fVar13 + fVar14 + fVar93 * 16.0;
                *(float *)((long)afStack_660 + lVar47 + 0x20c) =
                     fVar15 + fVar15 + fVar16 + fVar95 * 16.0;
                *(float *)((long)afStack_660 + lVar47 + 0x210) =
                     fVar17 + fVar17 + fVar18 + fVar97 * 16.0;
                *(float *)((long)afStack_660 + lVar47 + 0x214) =
                     fVar19 + fVar19 + fVar20 + fVar99 * 16.0;
                *(float *)((long)afStack_660 + lVar47 + 0x218) =
                     fVar21 + fVar21 + fVar22 + fVar101 * 16.0;
                *(float *)((long)afStack_660 + lVar47 + 0x21c) = fVar23 + fVar23 + fVar24 + fVar102;
                *(float *)((long)afStack_660 + lVar47 + 0x300) =
                     fVar72 * 4.0 + fVar88 + fVar80 * 8.0;
                *(float *)((long)afStack_660 + lVar47 + 0x304) =
                     fVar73 * 4.0 + fVar90 + fVar81 * 8.0;
                *(float *)((long)afStack_660 + lVar47 + 0x308) =
                     fVar74 * 4.0 + fVar92 + fVar82 * 8.0;
                *(float *)((long)afStack_660 + lVar47 + 0x30c) =
                     fVar75 * 4.0 + fVar94 + fVar83 * 8.0;
                *(float *)((long)afStack_660 + lVar47 + 0x310) =
                     fVar76 * 4.0 + fVar96 + fVar84 * 8.0;
                *(float *)((long)afStack_660 + lVar47 + 0x314) =
                     fVar77 * 4.0 + fVar98 + fVar85 * 8.0;
                *(float *)((long)afStack_660 + lVar47 + 0x318) =
                     fVar78 * 4.0 + fVar100 + fVar86 * 8.0;
                *(float *)((long)afStack_660 + lVar47 + 0x31c) = in_register_0000151c;
                *(float *)((long)afStack_660 + lVar47 + 0x400) = fVar9 * 8.0 + fVar10 + fVar89 * 4.0
                ;
                *(float *)((long)afStack_660 + lVar47 + 0x404) =
                     fVar11 * 8.0 + fVar12 + fVar91 * 4.0;
                *(float *)((long)afStack_660 + lVar47 + 0x408) =
                     fVar13 * 8.0 + fVar14 + fVar93 * 4.0;
                *(float *)((long)afStack_660 + lVar47 + 0x40c) =
                     fVar15 * 8.0 + fVar16 + fVar95 * 4.0;
                *(float *)((long)afStack_660 + lVar47 + 0x410) =
                     fVar17 * 8.0 + fVar18 + fVar97 * 4.0;
                *(float *)((long)afStack_660 + lVar47 + 0x414) =
                     fVar19 * 8.0 + fVar20 + fVar99 * 4.0;
                *(float *)((long)afStack_660 + lVar47 + 0x418) =
                     fVar21 * 8.0 + fVar22 + fVar101 * 4.0;
                *(float *)((long)afStack_660 + lVar47 + 0x41c) =
                     fVar102 + fVar24 + in_register_0000155c;
                *(float *)((long)afStack_660 + lVar47 + 0x500) =
                     fVar88 + fVar80 + fVar80 + fVar72 * 16.0;
                *(float *)((long)afStack_660 + lVar47 + 0x504) =
                     fVar90 + fVar81 + fVar81 + fVar73 * 16.0;
                *(float *)((long)afStack_660 + lVar47 + 0x508) =
                     fVar92 + fVar82 + fVar82 + fVar74 * 16.0;
                *(float *)((long)afStack_660 + lVar47 + 0x50c) =
                     fVar94 + fVar83 + fVar83 + fVar75 * 16.0;
                *(float *)((long)afStack_660 + lVar47 + 0x510) =
                     fVar96 + fVar84 + fVar84 + fVar76 * 16.0;
                *(float *)((long)afStack_660 + lVar47 + 0x514) =
                     fVar98 + fVar85 + fVar85 + fVar77 * 16.0;
                *(float *)((long)afStack_660 + lVar47 + 0x518) =
                     fVar100 + fVar86 + fVar86 + fVar78 * 16.0;
                *(float *)((long)afStack_660 + lVar47 + 0x51c) = fVar102 + fVar87 + fVar87 + fVar79;
                *(float *)((long)afStack_660 + lVar47 + 0x600) =
                     fVar89 + fVar9 * 32.0 + fVar10 + fVar64;
                *(float *)((long)afStack_660 + lVar47 + 0x604) =
                     fVar91 + fVar11 * 32.0 + fVar12 + fVar65;
                *(float *)((long)afStack_660 + lVar47 + 0x608) =
                     fVar93 + fVar13 * 32.0 + fVar14 + fVar66;
                *(float *)((long)afStack_660 + lVar47 + 0x60c) =
                     fVar95 + fVar15 * 32.0 + fVar16 + fVar67;
                *(float *)((long)afStack_660 + lVar47 + 0x610) =
                     fVar97 + fVar17 * 32.0 + fVar18 + fVar68;
                *(float *)((long)afStack_660 + lVar47 + 0x614) =
                     fVar99 + fVar19 * 32.0 + fVar20 + fVar69;
                *(float *)((long)afStack_660 + lVar47 + 0x618) =
                     fVar101 + fVar21 * 32.0 + fVar22 + fVar70;
                *(float *)((long)afStack_660 + lVar47 + 0x61c) =
                     auVar4._28_4_ + fVar23 + fVar24 + fVar71;
                lVar48 = lVar48 + (long)(iVar46 * 0x40) * 4;
                lVar47 = lVar47 + 0x20;
              } while (lVar47 != 0);
              pfVar49 = (float *)(((long)((uVar53 << 0x24) * 3) >> 0x1e) + local_840);
              lVar48 = 0xe0;
              do {
                auVar2 = *(undefined1 (*) [32])((long)&local_720 + lVar48);
                auVar3 = *(undefined1 (*) [32])((long)&local_700.data + lVar48);
                auVar4 = *(undefined1 (*) [32])((long)&local_700.allocator + lVar48);
                auVar5 = *(undefined1 (*) [32])((long)&local_700.cstep + lVar48);
                auVar6 = *(undefined1 (*) [32])((long)&local_6b0.elemsize + lVar48);
                auVar7 = *(undefined1 (*) [32])((long)&local_6b0.h + lVar48);
                auVar25 = vsubps_avx(auVar2,auVar3);
                fVar90 = auVar5._0_4_ + auVar4._0_4_;
                fVar92 = auVar5._4_4_ + auVar4._4_4_;
                fVar94 = auVar5._8_4_ + auVar4._8_4_;
                fVar96 = auVar5._12_4_ + auVar4._12_4_;
                fVar98 = auVar5._16_4_ + auVar4._16_4_;
                fVar100 = auVar5._20_4_ + auVar4._20_4_;
                fVar102 = auVar5._24_4_ + auVar4._24_4_;
                fVar103 = auVar5._28_4_ + auVar4._28_4_;
                auVar4 = vsubps_avx(auVar4,auVar5);
                fVar72 = auVar7._0_4_ + auVar6._0_4_;
                fVar73 = auVar7._4_4_ + auVar6._4_4_;
                fVar74 = auVar7._8_4_ + auVar6._8_4_;
                fVar75 = auVar7._12_4_ + auVar6._12_4_;
                fVar76 = auVar7._16_4_ + auVar6._16_4_;
                fVar77 = auVar7._20_4_ + auVar6._20_4_;
                fVar78 = auVar7._24_4_ + auVar6._24_4_;
                fVar79 = auVar7._28_4_ + auVar6._28_4_;
                auVar5 = vsubps_avx(auVar6,auVar7);
                fVar64 = auVar2._0_4_ + fVar56 + auVar3._0_4_;
                fVar65 = auVar2._4_4_ + fVar57 + auVar3._4_4_;
                fVar66 = auVar2._8_4_ + fVar58 + auVar3._8_4_;
                fVar67 = auVar2._12_4_ + fVar59 + auVar3._12_4_;
                fVar68 = auVar2._16_4_ + fVar60 + auVar3._16_4_;
                fVar69 = auVar2._20_4_ + fVar61 + auVar3._20_4_;
                fVar70 = auVar2._24_4_ + fVar62 + auVar3._24_4_;
                fVar71 = auVar2._28_4_ + fVar63 + auVar3._28_4_;
                fVar17 = *(float *)((long)&local_740 + lVar48 + 4);
                fVar18 = *(float *)((long)&local_738 + lVar48);
                fVar19 = *(float *)((long)&local_738 + lVar48 + 4);
                fVar20 = *(float *)((long)&local_730 + lVar48);
                fVar21 = *(float *)((long)&local_730 + lVar48 + 4);
                fVar22 = *(float *)((long)&local_728 + lVar48);
                fVar23 = *(float *)((long)&local_728 + lVar48 + 4);
                fVar87 = fVar103 + auVar7._28_4_;
                fVar9 = auVar4._0_4_;
                fVar10 = auVar4._4_4_;
                fVar11 = auVar4._8_4_;
                fVar12 = auVar4._12_4_;
                fVar13 = auVar4._16_4_;
                fVar14 = auVar4._20_4_;
                fVar15 = auVar4._24_4_;
                fVar16 = auVar4._28_4_;
                fVar80 = auVar5._0_4_;
                fVar81 = auVar5._4_4_;
                fVar82 = auVar5._8_4_;
                fVar83 = auVar5._12_4_;
                fVar84 = auVar5._16_4_;
                fVar85 = auVar5._20_4_;
                fVar86 = auVar5._24_4_;
                fVar89 = auVar25._0_4_ + fVar56;
                fVar91 = auVar25._4_4_ + fVar57;
                fVar93 = auVar25._8_4_ + fVar58;
                fVar95 = auVar25._12_4_ + fVar59;
                fVar97 = auVar25._16_4_ + fVar60;
                fVar99 = auVar25._20_4_ + fVar61;
                fVar101 = auVar25._24_4_ + fVar62;
                fVar88 = auVar25._28_4_ + fVar63;
                in_register_0000151c = fVar103 + fVar88 + in_register_0000155c;
                fVar24 = *(float *)((long)afStack_660 + lVar48);
                fVar27 = *(float *)((long)afStack_660 + lVar48 + 4);
                fVar28 = *(float *)((long)afStack_660 + lVar48 + 8);
                fVar29 = *(float *)((long)afStack_660 + lVar48 + 0xc);
                fVar30 = *(float *)((long)afStack_660 + lVar48 + 0x10);
                fVar31 = *(float *)((long)afStack_660 + lVar48 + 0x14);
                fVar32 = *(float *)((long)afStack_660 + lVar48 + 0x18);
                fVar33 = *(float *)((long)afStack_660 + lVar48 + 0x1c);
                pfVar49[-0x28] =
                     fVar90 + fVar72 * 32.0 + fVar64 + *(float *)((long)&local_740 + lVar48);
                pfVar49[-0x27] = fVar92 + fVar73 * 32.0 + fVar65 + fVar17;
                pfVar49[-0x26] = fVar94 + fVar74 * 32.0 + fVar66 + fVar18;
                pfVar49[-0x25] = fVar96 + fVar75 * 32.0 + fVar67 + fVar19;
                pfVar49[-0x24] = fVar98 + fVar76 * 32.0 + fVar68 + fVar20;
                pfVar49[-0x23] = fVar100 + fVar77 * 32.0 + fVar69 + fVar21;
                pfVar49[-0x22] = fVar102 + fVar78 * 32.0 + fVar70 + fVar22;
                pfVar49[-0x21] = fVar87 + fVar71 + fVar23;
                pfVar49[-0x20] = fVar9 + fVar9 + fVar89 + fVar80 * 16.0;
                pfVar49[-0x1f] = fVar10 + fVar10 + fVar91 + fVar81 * 16.0;
                pfVar49[-0x1e] = fVar11 + fVar11 + fVar93 + fVar82 * 16.0;
                pfVar49[-0x1d] = fVar12 + fVar12 + fVar95 + fVar83 * 16.0;
                pfVar49[-0x1c] = fVar13 + fVar13 + fVar97 + fVar84 * 16.0;
                pfVar49[-0x1b] = fVar14 + fVar14 + fVar99 + fVar85 * 16.0;
                pfVar49[-0x1a] = fVar15 + fVar15 + fVar101 + fVar86 * 16.0;
                pfVar49[-0x19] = fVar16 + fVar16 + fVar88 + fVar103;
                pfVar49[-0x18] = fVar90 * 4.0 + fVar64 + fVar72 * 8.0;
                pfVar49[-0x17] = fVar92 * 4.0 + fVar65 + fVar73 * 8.0;
                pfVar49[-0x16] = fVar94 * 4.0 + fVar66 + fVar74 * 8.0;
                pfVar49[-0x15] = fVar96 * 4.0 + fVar67 + fVar75 * 8.0;
                pfVar49[-0x14] = fVar98 * 4.0 + fVar68 + fVar76 * 8.0;
                pfVar49[-0x13] = fVar100 * 4.0 + fVar69 + fVar77 * 8.0;
                pfVar49[-0x12] = fVar102 * 4.0 + fVar70 + fVar78 * 8.0;
                pfVar49[-0x11] = fVar87 + fVar71 + in_register_0000155c;
                pfVar49[-0x10] = fVar9 * 8.0 + fVar89 + fVar80 * 4.0;
                pfVar49[-0xf] = fVar10 * 8.0 + fVar91 + fVar81 * 4.0;
                pfVar49[-0xe] = fVar11 * 8.0 + fVar93 + fVar82 * 4.0;
                pfVar49[-0xd] = fVar12 * 8.0 + fVar95 + fVar83 * 4.0;
                pfVar49[-0xc] = fVar13 * 8.0 + fVar97 + fVar84 * 4.0;
                pfVar49[-0xb] = fVar14 * 8.0 + fVar99 + fVar85 * 4.0;
                pfVar49[-10] = fVar15 * 8.0 + fVar101 + fVar86 * 4.0;
                pfVar49[-9] = in_register_0000151c;
                pfVar49[-8] = fVar90 * 16.0 + fVar72 + fVar72 + fVar64;
                pfVar49[-7] = fVar92 * 16.0 + fVar73 + fVar73 + fVar65;
                pfVar49[-6] = fVar94 * 16.0 + fVar74 + fVar74 + fVar66;
                pfVar49[-5] = fVar96 * 16.0 + fVar75 + fVar75 + fVar67;
                pfVar49[-4] = fVar98 * 16.0 + fVar76 + fVar76 + fVar68;
                pfVar49[-3] = fVar100 * 16.0 + fVar77 + fVar77 + fVar69;
                pfVar49[-2] = fVar102 * 16.0 + fVar78 + fVar78 + fVar70;
                pfVar49[-1] = fVar103 + fVar79 + fVar79 + fVar71;
                *pfVar49 = fVar80 + fVar89 + fVar9 * 32.0 + fVar24;
                pfVar49[1] = fVar81 + fVar91 + fVar10 * 32.0 + fVar27;
                pfVar49[2] = fVar82 + fVar93 + fVar11 * 32.0 + fVar28;
                pfVar49[3] = fVar83 + fVar95 + fVar12 * 32.0 + fVar29;
                pfVar49[4] = fVar84 + fVar97 + fVar13 * 32.0 + fVar30;
                pfVar49[5] = fVar85 + fVar99 + fVar14 * 32.0 + fVar31;
                pfVar49[6] = fVar86 + fVar101 + fVar15 * 32.0 + fVar32;
                pfVar49[7] = auVar5._28_4_ + fVar88 + fVar16 + fVar33;
                lVar48 = lVar48 + 0x100;
                pfVar49 = pfVar49 + (iVar51 << 3);
              } while (lVar48 != 0x6e0);
              uVar53 = uVar53 + 1;
              lVar54 = lVar54 + 0x20;
            } while (uVar53 != uVar26);
          }
          uVar50 = uVar50 + 1;
          local_838 = local_838 + local_710;
          local_840 = local_840 +
                      (long)local_800.w *
                      CONCAT44(local_800.elemsize._4_4_,(undefined4)local_800.elemsize) * 6;
        } while (uVar50 != local_708);
      }
      uVar50 = local_7a8 + 1;
      dst = local_7b0;
      iVar52 = local_800.w;
      iVar44 = local_800.h;
    } while (local_7a8 + 1 != local_720);
  }
LAB_0024c5d6:
  copy_cut_border(&local_800,dst,0,iVar44 - dst->h,0,iVar52 - dst->w,opt);
  piVar8 = (int *)CONCAT44(local_800.refcount._4_4_,local_800.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_800.allocator == (Allocator *)0x0) {
        if (local_800.data != (void *)0x0) {
          free(local_800.data);
        }
      }
      else {
        (*(local_800.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar8 = (int *)CONCAT44(local_700.refcount._4_4_,local_700.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_700.allocator == (Allocator *)0x0) {
        if (local_700.data != (void *)0x0) {
          free(local_700.data);
        }
      }
      else {
        (*(local_700.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar8 = (int *)CONCAT44(local_6b0.refcount._4_4_,local_6b0.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_6b0.allocator == (Allocator *)0x0) {
        if (local_6b0.data != (void *)0x0) {
          free(local_6b0.data);
        }
      }
      else {
        (*(local_6b0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar8 = (int *)CONCAT44(local_7a0.refcount._4_4_,local_7a0.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_7a0.allocator == (Allocator *)0x0) {
        if (local_7a0.data != (void *)0x0) {
          free(local_7a0.data);
        }
      }
      else {
        (*(local_7a0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 6n+2
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 5) / 6 * 6;
    outh = (outh + 5) / 6 * 6;

    w = outw + 2;
    h = outh + 2;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, BORDER_CONSTANT, 0.f, opt);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 6;
        int h_tiles = outh / 6;
        const int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 64, inch, elemsize, elempack, opt.workspace_allocator);
        conv3x3s1_winograd63_transform_input_pack8_avx(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    convolution_winograd_dot_pack8_avx(bottom_blob_tm, outch, kernel_tm, top_blob_tm, opt);
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, elemsize, elempack, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd63_transform_output_pack8_avx(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}